

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS ref_shard_mark_to_split(REF_SHARD ref_shard,REF_INT node0,REF_INT node1)

{
  int iVar1;
  REF_INT *pRVar2;
  uint uVar3;
  undefined8 in_RAX;
  long lVar4;
  char *pcVar5;
  undefined8 uStack_30;
  REF_INT face;
  
  face = (REF_INT)((ulong)in_RAX >> 0x20);
  uVar3 = ref_face_spanning(ref_shard->face,node0,node1,&face);
  if (uVar3 == 0) {
    pRVar2 = ref_shard->face->f2n;
    lVar4 = (long)face;
    iVar1 = pRVar2[lVar4 * 4 + 2];
    if (iVar1 == node0 || iVar1 == node1) {
      if (ref_shard->mark[lVar4] != 3) {
        ref_shard->mark[lVar4] = 2;
        return 0;
      }
      pcVar5 = "2-3 mark mismatch";
      uStack_30 = 0x49;
    }
    else {
      iVar1 = pRVar2[(int)(face * 4 | 3)];
      if (iVar1 != node0 && iVar1 != node1) {
        return 1;
      }
      if (ref_shard->mark[lVar4] != 2) {
        ref_shard->mark[lVar4] = 3;
        return 0;
      }
      pcVar5 = "3-2 mark mismatch";
      uStack_30 = 0x51;
    }
    uVar3 = 1;
  }
  else {
    pcVar5 = "missing face";
    uStack_30 = 0x44;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uStack_30
         ,"ref_shard_mark_to_split",(ulong)uVar3,pcVar5);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_shard_mark_to_split(REF_SHARD ref_shard, REF_INT node0,
                                           REF_INT node1) {
  REF_INT face;

  RSS(ref_face_spanning(ref_shard_face(ref_shard), node0, node1, &face),
      "missing face");

  if (node0 == ref_face_f2n(ref_shard_face(ref_shard), 2, face) ||
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 2, face)) {
    if (3 == ref_shard_mark(ref_shard, face))
      RSS(REF_FAILURE, "2-3 mark mismatch");
    ref_shard_mark(ref_shard, face) = 2;
    return REF_SUCCESS;
  }

  if (node0 == ref_face_f2n(ref_shard_face(ref_shard), 3, face) ||
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 3, face)) {
    if (2 == ref_shard_mark(ref_shard, face))
      RSS(REF_FAILURE, "3-2 mark mismatch");
    ref_shard_mark(ref_shard, face) = 3;
    return REF_SUCCESS;
  }

  return REF_FAILURE;
}